

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::get_component<signed_char>(Omega_h *this,Read<signed_char> *a,Int ncomps,Int comp)

{
  int *piVar1;
  Alloc *pAVar2;
  int iVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  LO n;
  Read<signed_char> RVar5;
  Write<signed_char> b;
  type f;
  Write<signed_char> local_78;
  type local_68;
  Write<signed_char> local_40;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    iVar3 = (int)pAVar2->size;
  }
  else {
    iVar3 = (int)((ulong)pAVar2 >> 3);
  }
  iVar3 = divide_no_remainder<int>(iVar3,ncomps);
  local_68.b.shared_alloc_.alloc = (Alloc *)&local_68.a;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  Write<signed_char>::Write(&local_78,iVar3,(string *)&local_68);
  if (local_68.b.shared_alloc_.alloc != (Alloc *)&local_68.a) {
    operator_delete(local_68.b.shared_alloc_.alloc,
                    (ulong)((long)&(local_68.a.write_.shared_alloc_.alloc)->size + 1));
  }
  local_68.b.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_68.b.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68.b.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  local_68.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_68.a.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68.a.write_.shared_alloc_.alloc =
           (Alloc *)((local_68.a.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.a.write_.shared_alloc_.alloc)->use_count =
           (local_68.a.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  if (((ulong)local_78.shared_alloc_.alloc & 1) == 0) {
    n = (LO)(local_78.shared_alloc_.alloc)->size;
  }
  else {
    n = (LO)((ulong)local_78.shared_alloc_.alloc >> 3);
  }
  local_68.ncomps = ncomps;
  local_68.comp = comp;
  parallel_for<Omega_h::get_component<signed_char>(Omega_h::Read<signed_char>,int,int)::_lambda(int)_1_>
            (n,&local_68,"get_component");
  local_40.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
  local_40.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
  if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
       local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
    local_40.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_78.shared_alloc_.alloc = (Alloc *)0x0;
  local_78.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_40);
  pAVar2 = local_40.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 && local_40.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_40.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  pAVar2 = local_68.a.write_.shared_alloc_.alloc;
  if (((ulong)local_68.a.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_68.a.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.a.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  pAVar2 = local_68.b.shared_alloc_.alloc;
  if (((ulong)local_68.b.shared_alloc_.alloc & 7) == 0 &&
      local_68.b.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_68.b.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.b.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  pAVar2 = local_78.shared_alloc_.alloc;
  if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 && local_78.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar5.write_.shared_alloc_;
}

Assistant:

Read<T> get_component(Read<T> a, Int ncomps, Int comp) {
  Write<T> b(divide_no_remainder(a.size(), ncomps));
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = a[i * ncomps + comp]; };
  parallel_for(b.size(), f, "get_component");
  return b;
}